

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.hpp
# Opt level: O0

void MetaSim::Event::printQueue(void)

{
  bool bVar1;
  iterator this;
  reference ppEVar2;
  iterator it;
  priority_list<MetaSim::Event_*,_MetaSim::Event::Cmp,_std::allocator<MetaSim::Event_*>_>
  *in_stack_ffffffffffffffd8;
  _Self in_stack_ffffffffffffffe0;
  int iVar3;
  _Rb_tree_const_iterator<MetaSim::Event_*> local_8;
  
  std::_Rb_tree_const_iterator<MetaSim::Event_*>::_Rb_tree_const_iterator(&local_8);
  local_8._M_node =
       (_Base_ptr)
       priority_list<MetaSim::Event_*,_MetaSim::Event::Cmp,_std::allocator<MetaSim::Event_*>_>::
       begin(in_stack_ffffffffffffffd8);
  while( true ) {
    this = priority_list<MetaSim::Event_*,_MetaSim::Event::Cmp,_std::allocator<MetaSim::Event_*>_>::
           end(in_stack_ffffffffffffffd8);
    bVar1 = std::operator!=(&local_8,(_Self *)&stack0xffffffffffffffe8);
    if (!bVar1) break;
    ppEVar2 = std::_Rb_tree_const_iterator<MetaSim::Event_*>::operator*
                        ((_Rb_tree_const_iterator<MetaSim::Event_*> *)
                         in_stack_ffffffffffffffe0._M_node);
    iVar3 = (int)((ulong)in_stack_ffffffffffffffe0._M_node >> 0x20);
    (*(*ppEVar2)->_vptr_Event[3])();
    in_stack_ffffffffffffffe0 =
         std::_Rb_tree_const_iterator<MetaSim::Event_*>::operator++(this._M_node,iVar3);
  }
  return;
}

Assistant:

static void printQueue() {
            EventQueue::iterator it;
    
            for (it = _eventQueue.begin(); 
                 it != _eventQueue.end(); 
                 it++) 
                (*it)->print();
        }